

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

UINT8 StopAudioDevice(void)

{
  UINT8 local_9;
  UINT8 retVal;
  
  local_9 = '\0';
  if (audDrv != (void *)0x0) {
    local_9 = AudioDrv_Stop(audDrv);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&locAudBuf);
  return local_9;
}

Assistant:

static UINT8 StopAudioDevice(void)
{
	UINT8 retVal;
	
	retVal = 0x00;
	if (audDrv != NULL)
		retVal = AudioDrv_Stop(audDrv);
	locAudBuf.clear();
	
	return retVal;
}